

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_iterate64(roaring_bitmap_t *r,roaring_iterator64 iterator,uint64_t high_bits,void *ptr
                       )

{
  _Bool _Var1;
  roaring_iterator64 in_RCX;
  undefined8 in_RDX;
  container_t *in_RSI;
  int *in_RDI;
  int i;
  roaring_array_t *ra;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (*in_RDI <= iVar2) {
      return true;
    }
    _Var1 = container_iterate64(in_RSI,(uint8_t)((ulong)in_RDX >> 0x38),(uint32_t)in_RDX,in_RCX,
                                (uint64_t)in_RDI,(void *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    if (!_Var1) break;
    iVar2 = iVar2 + 1;
  }
  return false;
}

Assistant:

bool roaring_iterate64(const roaring_bitmap_t *r, roaring_iterator64 iterator,
                       uint64_t high_bits, void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate64(ra->containers[i], ra->typecodes[i],
                                 ((uint32_t)ra->keys[i]) << 16, iterator,
                                 high_bits, ptr)) {
            return false;
        }
    return true;
}